

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshBuffer.h
# Opt level: O2

void __thiscall
irr::scene::CMeshBuffer<irr::video::S3DVertex2TCoords>::recalculateBoundingBox
          (CMeshBuffer<irr::video::S3DVertex2TCoords> *this)

{
  aabbox3d<float> *this_00;
  vector3d<float> *pvVar1;
  pointer pSVar2;
  pointer pSVar3;
  float fVar4;
  ulong uVar5;
  long lVar6;
  
  pSVar2 = (this->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->BoundingBox;
  pvVar1 = &(this->BoundingBox).MaxEdge;
  if (pSVar2 == pSVar3) {
    (this->BoundingBox).MaxEdge.X = 0.0;
    (this->BoundingBox).MaxEdge.Y = 0.0;
    (this->BoundingBox).MaxEdge.Z = 0.0;
    (this->BoundingBox).MinEdge.Z = (this->BoundingBox).MaxEdge.Z;
    fVar4 = pvVar1->Y;
    (this_00->MinEdge).X = pvVar1->X;
    (this_00->MinEdge).Y = fVar4;
  }
  else {
    (this->BoundingBox).MaxEdge.Z = (pSVar2->super_S3DVertex).Pos.Z;
    fVar4 = (pSVar2->super_S3DVertex).Pos.Y;
    pvVar1->X = (pSVar2->super_S3DVertex).Pos.X;
    pvVar1->Y = fVar4;
    (this->BoundingBox).MinEdge.Z = (pSVar2->super_S3DVertex).Pos.Z;
    fVar4 = (pSVar2->super_S3DVertex).Pos.Y;
    (this_00->MinEdge).X = (pSVar2->super_S3DVertex).Pos.X;
    (this_00->MinEdge).Y = fVar4;
    lVar6 = 0x2c;
    for (uVar5 = 1; uVar5 < (((long)pSVar3 - (long)pSVar2) / 0x2c & 0xffffffffU); uVar5 = uVar5 + 1)
    {
      core::aabbox3d<float>::addInternalPoint
                (this_00,(vector3d<float> *)
                         ((long)&(((this->Vertices).m_data.
                                   super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_S3DVertex).Pos
                         + lVar6));
      lVar6 = lVar6 + 0x2c;
    }
  }
  return;
}

Assistant:

void recalculateBoundingBox() override
	{
		if (!Vertices.empty()) {
			BoundingBox.reset(Vertices[0].Pos);
			const irr::u32 vsize = Vertices.size();
			for (u32 i = 1; i < vsize; ++i)
				BoundingBox.addInternalPoint(Vertices[i].Pos);
		} else
			BoundingBox.reset(0, 0, 0);
	}